

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

bool __thiscall
Shell::Options::InputFileOptionValue::setValue(InputFileOptionValue *this,string *value)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  string *in_RSI;
  long in_RDI;
  bool bVar4;
  int b;
  int e;
  int length;
  char *name;
  int local_4c;
  int local_48;
  string local_28 [32];
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0xb8),in_RSI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_48 = std::__cxx11::string::length();
    lVar3 = std::__cxx11::string::c_str();
    local_4c = local_48;
    do {
      iVar1 = local_4c;
      local_4c = iVar1 + -1;
      bVar4 = false;
      if (-1 < local_4c) {
        bVar4 = *(char *)(lVar3 + local_4c) != '/';
      }
    } while (bVar4);
    do {
      local_48 = local_48 + -1;
      bVar4 = false;
      if (iVar1 <= local_48) {
        bVar4 = *(char *)(lVar3 + local_48) != '.';
      }
    } while (bVar4);
    std::__cxx11::string::substr((ulong)local_28,(ulong)in_RSI);
    std::__cxx11::string::operator=((string *)(*(long *)(in_RDI + 0x118) + 0x82d8),local_28);
    std::__cxx11::string::~string(local_28);
  }
  return true;
}

Assistant:

bool Options::InputFileOptionValue::setValue(const std::string& value)
{
  actualValue=value;
  if(value.empty()) return true;

  //update the problem name

  int length = value.length();
  const char* name = value.c_str();

  int b = length - 1;
  while (b >= 0 && name[b] != '/') {
    b--;
  }
  b++;

  int e = length - 1;
  while (e >= b && name[e] != '.') {
    e--;
  }
  if (e < b) {
    e = length;
  }

  parent->_problemName.actualValue=value.substr(b,e-b);

  return true;

}